

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O2

void __thiscall
Rml::ElementFormControlTextArea::SetWordWrap(ElementFormControlTextArea *this,bool word_wrap)

{
  bool bVar1;
  allocator<char> local_31;
  String local_30;
  
  bVar1 = GetWordWrap(this);
  if (bVar1 != word_wrap) {
    if (word_wrap) {
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"wrap",&local_31);
      Element::RemoveAttribute((Element *)this,&local_30);
    }
    else {
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"wrap",&local_31);
      Element::SetAttribute<char[7]>((Element *)this,&local_30,(char (*) [7])"nowrap");
    }
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void ElementFormControlTextArea::SetWordWrap(bool word_wrap)
{
	if (word_wrap != GetWordWrap())
	{
		if (word_wrap)
			RemoveAttribute("wrap");
		else
			SetAttribute("wrap", "nowrap");
	}
}